

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O3

void __thiscall
duckdb::BaseScanner::Process<duckdb::StringValueResult>(BaseScanner *this,StringValueResult *result)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar1;
  idx_t iVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  CSVState CVar6;
  CSVState CVar7;
  char cVar8;
  idx_t iVar9;
  CSVStates *pCVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  CSVStateMachine *pCVar16;
  CSVBufferHandle *pCVar17;
  idx_t iVar18;
  idx_t iVar19;
  ulong uVar20;
  
  this_00 = &this->state_machine;
  pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  cVar3 = (pCVar16->dialect_options).state_machine_options.escape.value;
  pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  if ((((pCVar16->state_machine_options).strict_mode.value == true) &&
      (pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
      (pCVar16->state_machine_options).strict_mode.set_by_user == true)) &&
     (pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar16->state_machine_options).new_line.value == CARRY_ON)) {
    pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    cVar4 = (pCVar16->state_machine_options).new_line.set_by_user;
  }
  else {
    cVar4 = '\0';
  }
  iVar9 = (this->iterator).pos.buffer_pos;
  if ((this->iterator).is_set == true) {
    iVar18 = (this->iterator).boundary.end_pos;
    pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    if (iVar18 <= pCVar17->actual_size) goto LAB_017eb219;
  }
  pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
  iVar18 = pCVar17->actual_size;
LAB_017eb219:
  uVar20 = (this->iterator).pos.buffer_pos;
  if (uVar20 < iVar18) {
    uVar1 = iVar18 - 1;
    do {
      pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar19 = (this->iterator).pos.buffer_pos;
      bVar5 = this->buffer_handle_ptr[iVar19];
      CVar6 = (this->states).states[1];
      (this->states).states[0] = CVar6;
      CVar7 = pCVar16->transition_array->state_machine[bVar5][CVar6];
      (this->states).states[1] = CVar7;
      switch(CVar7) {
      case STANDARD:
        iVar2 = iVar19 + 1;
        (this->iterator).pos.buffer_pos = iVar2;
        uVar20 = iVar19 + 9;
        while (uVar20 < iVar18) {
          uVar20 = *(ulong *)(this->buffer_handle_ptr + iVar2);
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar16->transition_array->delimiter;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar11 = pCVar16->transition_array->new_line;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar12 = pCVar16->transition_array->carriage_return;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar13 = pCVar16->transition_array->escape;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar20 = (uVar20 ^ pCVar16->transition_array->comment) &
                   (uVar13 ^ uVar20) & (uVar12 ^ uVar20) & (uVar11 ^ uVar20) & (uVar14 ^ uVar20);
          if ((~(0x101010101010100 - uVar20 | uVar20) & 0x8080808080808080) != 0) break;
          iVar19 = (this->iterator).pos.buffer_pos;
          iVar2 = iVar19 + 8;
          (this->iterator).pos.buffer_pos = iVar2;
          uVar20 = iVar19 + 0x10;
        }
        pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar20 = (this->iterator).pos.buffer_pos;
        if (uVar20 < uVar1) {
          cVar8 = pCVar16->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar20]];
          while (cVar8 != '\0') {
            (this->iterator).pos.buffer_pos = uVar20 + 1;
            pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            uVar20 = (this->iterator).pos.buffer_pos;
            if (uVar1 <= uVar20) break;
            cVar8 = pCVar16->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar20]];
          }
        }
        goto LAB_017eb58f;
      case DELIMITER:
        StringValueResult::AddValue(result,iVar19);
        goto LAB_017eb584;
      case RECORD_SEPARATOR:
        if (CVar6 == NOT_SET) {
LAB_017eb55d:
          bVar15 = StringValueResult::EmptyLine(result,iVar19);
        }
        else {
          if (CVar6 == CARRIAGE_RETURN) goto LAB_017eb584;
          if (CVar6 == RECORD_SEPARATOR) goto LAB_017eb55d;
          if ((result->super_ScannerResult).comment != true) {
            bVar15 = StringValueResult::AddRow(result,iVar19);
            goto joined_r0x017eb56a;
          }
          uVar20 = (result->super_ScannerResult).last_position.buffer_pos;
          uVar14 = result->position_before_comment;
          if (uVar20 < uVar14) {
            do {
              if (result->buffer_ptr[uVar20] != ' ') goto LAB_017eb729;
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
LAB_017eb785:
            bVar15 = false;
          }
          else {
            if (result->cur_col_id == 0) goto LAB_017eb785;
LAB_017eb729:
            bVar15 = StringValueResult::AddRow(result,uVar14);
          }
          if (result->number_of_rows == 0) {
            result->first_line_is_comment = true;
          }
          (result->super_ScannerResult).comment = false;
          (result->super_ScannerResult).last_position.buffer_pos =
               ((((result->super_ScannerResult).state_machine)->dialect_options).
                state_machine_options.new_line.value == CARRY_ON) + iVar19 + 1;
          result->cur_col_id = 0;
          result->chunk_col_id = 0;
        }
joined_r0x017eb56a:
        if (bVar15 != false) {
          iVar18 = (this->iterator).pos.buffer_pos + 1;
          (this->iterator).pos.buffer_pos = iVar18;
          this->bytes_read = iVar18 - iVar9;
          goto LAB_017eb836;
        }
        this->lines_read = this->lines_read + 1;
LAB_017eb584:
        iVar19 = (this->iterator).pos.buffer_pos;
        break;
      case CARRIAGE_RETURN:
        if (CVar6 == NOT_SET) {
LAB_017eb3e2:
          bVar15 = StringValueResult::EmptyLine(result,iVar19);
LAB_017eb3ed:
          iVar19 = (this->iterator).pos.buffer_pos;
joined_r0x017eb3f3:
          if (bVar15 != false) {
            (this->iterator).pos.buffer_pos = iVar19 + 1;
            this->bytes_read = (iVar19 + 1) - iVar9;
LAB_017eb836:
            this->lines_read = this->lines_read + 1;
            return;
          }
        }
        else if (CVar6 != CARRIAGE_RETURN) {
          if (CVar6 == RECORD_SEPARATOR) goto LAB_017eb3e2;
          if ((result->super_ScannerResult).comment != true) {
            if (cVar4 != '\0') goto LAB_017eb3f9;
            bVar15 = StringValueResult::AddRow(result,iVar19);
            goto LAB_017eb3ed;
          }
          uVar20 = (result->super_ScannerResult).last_position.buffer_pos;
          uVar14 = result->position_before_comment;
          if (uVar20 < uVar14) {
            do {
              if (result->buffer_ptr[uVar20] != ' ') goto LAB_017eb715;
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
LAB_017eb733:
            bVar15 = false;
          }
          else {
            if (result->cur_col_id == 0) goto LAB_017eb733;
LAB_017eb715:
            bVar15 = StringValueResult::AddRow(result,uVar14);
          }
          if (result->number_of_rows == 0) {
            result->first_line_is_comment = true;
          }
          (result->super_ScannerResult).comment = false;
          (result->super_ScannerResult).last_position.buffer_pos =
               ((((result->super_ScannerResult).state_machine)->dialect_options).
                state_machine_options.new_line.value == CARRY_ON) + iVar19 + 1;
          result->cur_col_id = 0;
          result->chunk_col_id = 0;
          iVar19 = (this->iterator).pos.buffer_pos;
          goto joined_r0x017eb3f3;
        }
LAB_017eb3f9:
        uVar20 = iVar19 + 1;
        (this->iterator).pos.buffer_pos = uVar20;
        this->lines_read = this->lines_read + 1;
        goto LAB_017eb58f;
      case QUOTED:
        if (((CVar6 == MAYBE_QUOTED) || (CVar6 == UNQUOTED)) && (cVar3 != '\0')) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        this->ever_quoted = true;
        if ((result->super_ScannerResult).quoted == false) {
          (result->super_ScannerResult).quoted_position = iVar19;
        }
        (result->super_ScannerResult).quoted = true;
        (result->super_ScannerResult).unquoted = true;
        iVar2 = iVar19 + 1;
        (this->iterator).pos.buffer_pos = iVar2;
        uVar20 = iVar19 + 9;
        while (uVar20 < iVar18) {
          uVar20 = *(ulong *)(this->buffer_handle_ptr + iVar2);
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar16->transition_array->quote;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar20 = (uVar20 ^ pCVar16->transition_array->escape) & (uVar14 ^ uVar20);
          if ((~(0x101010101010100 - uVar20 | uVar20) & 0x8080808080808080) != 0) break;
          iVar19 = (this->iterator).pos.buffer_pos;
          iVar2 = iVar19 + 8;
          (this->iterator).pos.buffer_pos = iVar2;
          uVar20 = iVar19 + 0x10;
        }
        pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar20 = (this->iterator).pos.buffer_pos;
        while ((uVar20 < uVar1 &&
               (pCVar16->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar20]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar20 + 1;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar20 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_017eb58f;
      case UNQUOTED:
        if (CVar6 == MAYBE_QUOTED) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        pCVar10 = (result->super_ScannerResult).states;
        if (((pCVar10->states[0] == UNQUOTED) && (pCVar10->states[1] == UNQUOTED)) &&
           ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
            escape.value != '\0')) {
          (result->super_ScannerResult).escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        (result->super_ScannerResult).escaped = true;
        this->ever_escaped = true;
        break;
      case INVALID:
        StringValueResult::InvalidState(result);
        iVar18 = (this->iterator).pos.buffer_pos + 1;
        (this->iterator).pos.buffer_pos = iVar18;
        this->bytes_read = iVar18 - iVar9;
        return;
      case QUOTED_NEW_LINE:
        result->quoted_new_line = true;
        break;
      case COMMENT:
        if ((result->super_ScannerResult).comment == false) {
          result->position_before_comment = iVar19;
          (result->super_ScannerResult).comment = true;
        }
        iVar2 = iVar19 + 1;
        (this->iterator).pos.buffer_pos = iVar2;
        uVar20 = iVar19 + 9;
        while (uVar20 < iVar18) {
          uVar20 = *(ulong *)(this->buffer_handle_ptr + iVar2);
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar16->transition_array->new_line;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar20 = (uVar20 ^ pCVar16->transition_array->carriage_return) & (uVar14 ^ uVar20);
          if ((~(0x101010101010100 - uVar20 | uVar20) & 0x8080808080808080) != 0) break;
          iVar19 = (this->iterator).pos.buffer_pos;
          iVar2 = iVar19 + 8;
          (this->iterator).pos.buffer_pos = iVar2;
          uVar20 = iVar19 + 0x10;
        }
        pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar20 = (this->iterator).pos.buffer_pos;
        while ((uVar20 < uVar1 &&
               (pCVar16->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar20]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar20 + 1;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar20 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_017eb58f;
      }
      uVar20 = iVar19 + 1;
      (this->iterator).pos.buffer_pos = uVar20;
LAB_017eb58f:
    } while (uVar20 < iVar18);
  }
  this->bytes_read = uVar20 - iVar9;
  return;
}

Assistant:

void Process(T &result) {
		idx_t to_pos;
		const bool has_escaped_value = state_machine->dialect_options.state_machine_options.escape != '\0';
		const bool only_rn_newlines =
		    state_machine->state_machine_options.strict_mode.GetValue() &&
		    state_machine->state_machine_options.strict_mode.IsSetByUser() &&
		    state_machine->state_machine_options.new_line.GetValue() == NewLineIdentifier::CARRY_ON &&
		    state_machine->state_machine_options.new_line.IsSetByUser();
		const idx_t start_pos = iterator.pos.buffer_pos;
		if (iterator.IsBoundarySet()) {
			to_pos = iterator.GetEndPos();
			if (to_pos > cur_buffer_handle->actual_size) {
				to_pos = cur_buffer_handle->actual_size;
			}
		} else {
			to_pos = cur_buffer_handle->actual_size;
		}
		while (iterator.pos.buffer_pos < to_pos) {
			state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
			switch (states.states[1]) {
			case CSVState::INVALID:
				T::InvalidState(result);
				iterator.pos.buffer_pos++;
				bytes_read = iterator.pos.buffer_pos - start_pos;
				return;
			case CSVState::RECORD_SEPARATOR:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
					lines_read++;

				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
					lines_read++;
				}
				iterator.pos.buffer_pos++;
				break;
			case CSVState::CARRIAGE_RETURN:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else if (!only_rn_newlines) {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				break;
			case CSVState::DELIMITER:
				T::AddValue(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::QUOTED: {
				if ((states.states[0] == CSVState::UNQUOTED || states.states[0] == CSVState::MAYBE_QUOTED) &&
				    has_escaped_value) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				ever_quoted = true;
				T::SetQuoted(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.quote) &
					                     (value ^ state_machine->transition_array.escape))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}

				while (state_machine->transition_array
				           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
			} break;
			case CSVState::UNQUOTED: {
				if (states.states[0] == CSVState::MAYBE_QUOTED) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				T::SetUnquoted(result);
				iterator.pos.buffer_pos++;
				break;
			}
			case CSVState::ESCAPE:
			case CSVState::UNQUOTED_ESCAPE:
			case CSVState::ESCAPED_RETURN:
				T::SetEscaped(result);
				ever_escaped = true;
				iterator.pos.buffer_pos++;
				break;
			case CSVState::STANDARD: {
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.delimiter) &
					                     (value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return) &
					                     (value ^ state_machine->transition_array.escape) &
					                     (value ^ state_machine->transition_array.comment))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			case CSVState::QUOTED_NEW_LINE:
				T::QuotedNewLine(result);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::COMMENT: {
				T::SetComment(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			default:
				iterator.pos.buffer_pos++;
				break;
			}
		}
		bytes_read = iterator.pos.buffer_pos - start_pos;
	}